

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPSymmetricAlgorithm.cpp
# Opt level: O0

bool __thiscall
OSSLEVPSymmetricAlgorithm::encryptUpdate
          (OSSLEVPSymmetricAlgorithm *this,ByteString *data,ByteString *encryptedData)

{
  BIGNUM *a;
  EVP_CIPHER_CTX *ctx;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uchar *out;
  uchar *in;
  ulong e;
  char *pcVar4;
  SymmetricAlgorithm *in_RDI;
  ByteString dummy;
  int outLen;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  OSSLEVPSymmetricAlgorithm *in_stack_ffffffffffffff60;
  ByteString *pBVar5;
  SymmetricAlgorithm *in_stack_ffffffffffffff68;
  ByteString local_50;
  int local_24 [8];
  byte local_1;
  
  bVar1 = SymmetricAlgorithm::encryptUpdate
                    (in_stack_ffffffffffffff68,(ByteString *)in_stack_ffffffffffffff60,
                     (ByteString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (bVar1) {
    sVar3 = ByteString::size((ByteString *)0x1bb269);
    if (sVar3 == 0) {
      ByteString::resize((ByteString *)in_stack_ffffffffffffff60,
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      local_1 = 1;
    }
    else {
      if (in_RDI[1].currentKey != (SymmetricKey *)0x0) {
        a = *(BIGNUM **)&in_RDI[1].currentCipherMode;
        sVar3 = ByteString::size((ByteString *)0x1bb2b4);
        BN_add_word(a,sVar3);
      }
      ByteString::size((ByteString *)0x1bb2db);
      (*in_RDI->_vptr_SymmetricAlgorithm[0xd])();
      ByteString::resize((ByteString *)in_stack_ffffffffffffff60,
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      sVar3 = ByteString::size((ByteString *)0x1bb30e);
      local_24[0] = (int)sVar3;
      ctx = (EVP_CIPHER_CTX *)in_RDI[1]._vptr_SymmetricAlgorithm;
      out = ByteString::operator[]
                      ((ByteString *)in_stack_ffffffffffffff60,
                       CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      in = ByteString::const_byte_str
                     ((ByteString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      sVar3 = ByteString::size((ByteString *)0x1bb35b);
      iVar2 = EVP_EncryptUpdate(ctx,out,local_24,in,(int)sVar3);
      if (iVar2 == 0) {
        e = ERR_get_error();
        pcVar4 = ERR_error_string(e,(char *)0x0);
        softHSMLog(3,"encryptUpdate",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                   ,0xf4,"EVP_EncryptUpdate failed: %s",pcVar4);
        clean(in_stack_ffffffffffffff60);
        pBVar5 = &local_50;
        ByteString::ByteString((ByteString *)0x1bb3dc);
        SymmetricAlgorithm::encryptFinal(in_RDI,pBVar5);
        local_1 = 0;
        ByteString::~ByteString((ByteString *)0x1bb3ff);
      }
      else {
        ByteString::resize((ByteString *)in_stack_ffffffffffffff60,
                           CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        in_RDI->currentBufferSize = in_RDI->currentBufferSize - (long)local_24[0];
        local_1 = 1;
      }
    }
  }
  else {
    clean(in_stack_ffffffffffffff60);
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLEVPSymmetricAlgorithm::encryptUpdate(const ByteString& data, ByteString& encryptedData)
{
	if (!SymmetricAlgorithm::encryptUpdate(data, encryptedData))
	{
		clean();
		return false;
	}

	if (data.size() == 0)
	{
		encryptedData.resize(0);

		return true;
	}

	// Count number of bytes written
	if (maximumBytes)
	{
		BN_add_word(counterBytes, data.size());
	}

	// Prepare the output block
	encryptedData.resize(data.size() + getBlockSize() - 1);

	int outLen = encryptedData.size();
	if (!EVP_EncryptUpdate(pCurCTX, &encryptedData[0], &outLen, (unsigned char*) data.const_byte_str(), data.size()))
	{
		ERROR_MSG("EVP_EncryptUpdate failed: %s", ERR_error_string(ERR_get_error(), NULL));

		clean();

		ByteString dummy;
		SymmetricAlgorithm::encryptFinal(dummy);

		return false;
	}

	// Resize the output block
	encryptedData.resize(outLen);
	currentBufferSize -= outLen;

	return true;
}